

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_points.cpp
# Opt level: O3

void * __thiscall
embree::Points::getBufferData
          (Points *this,RTCBufferType type,uint slot,BufferDataPointerType pointerType)

{
  undefined8 *puVar1;
  char **ppcVar2;
  undefined1 *local_38;
  long local_30;
  undefined1 local_28 [16];
  
  if (type == RTC_BUFFER_TYPE_NORMAL) {
    if ((this->normals).size_active <= (ulong)slot) {
      puVar1 = (undefined8 *)__cxa_allocate_exception(0x30);
      local_38 = local_28;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"invalid buffer slot","");
      *puVar1 = &PTR__rtcore_error_02184a18;
      *(undefined4 *)(puVar1 + 1) = 2;
      puVar1[2] = puVar1 + 4;
      std::__cxx11::string::_M_construct<char*>((string *)(puVar1 + 2),local_38,local_38 + local_30)
      ;
      __cxa_throw(puVar1,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
    }
    ppcVar2 = (char **)((this->normals).items + slot);
    if (pointerType == HOST) goto LAB_009ed637;
    if (pointerType != DEVICE) {
      puVar1 = (undefined8 *)__cxa_allocate_exception(0x30);
      local_38 = local_28;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_38,"invalid buffer data pointer type specified","");
      *puVar1 = &PTR__rtcore_error_02184a18;
      *(undefined4 *)(puVar1 + 1) = 2;
      puVar1[2] = puVar1 + 4;
      std::__cxx11::string::_M_construct<char*>((string *)(puVar1 + 2),local_38,local_38 + local_30)
      ;
      __cxa_throw(puVar1,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
    }
  }
  else if (type == RTC_BUFFER_TYPE_VERTEX_ATTRIBUTE) {
    if ((this->vertexAttribs).size_active <= (ulong)slot) {
      puVar1 = (undefined8 *)__cxa_allocate_exception(0x30);
      local_38 = local_28;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"invalid buffer slot","");
      *puVar1 = &PTR__rtcore_error_02184a18;
      *(undefined4 *)(puVar1 + 1) = 2;
      puVar1[2] = puVar1 + 4;
      std::__cxx11::string::_M_construct<char*>((string *)(puVar1 + 2),local_38,local_38 + local_30)
      ;
      __cxa_throw(puVar1,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
    }
    ppcVar2 = (char **)((this->vertexAttribs).items + slot);
    if (pointerType == HOST) goto LAB_009ed637;
    if (pointerType != DEVICE) {
      puVar1 = (undefined8 *)__cxa_allocate_exception(0x30);
      local_38 = local_28;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_38,"invalid buffer data pointer type specified","");
      *puVar1 = &PTR__rtcore_error_02184a18;
      *(undefined4 *)(puVar1 + 1) = 2;
      puVar1[2] = puVar1 + 4;
      std::__cxx11::string::_M_construct<char*>((string *)(puVar1 + 2),local_38,local_38 + local_30)
      ;
      __cxa_throw(puVar1,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
    }
  }
  else {
    if (type != RTC_BUFFER_TYPE_VERTEX) {
      puVar1 = (undefined8 *)__cxa_allocate_exception(0x30);
      local_38 = local_28;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"unknown buffer type","");
      *puVar1 = &PTR__rtcore_error_02184a18;
      *(undefined4 *)(puVar1 + 1) = 2;
      puVar1[2] = puVar1 + 4;
      std::__cxx11::string::_M_construct<char*>((string *)(puVar1 + 2),local_38,local_38 + local_30)
      ;
      __cxa_throw(puVar1,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
    }
    if ((this->vertices).size_active <= (ulong)slot) {
      puVar1 = (undefined8 *)__cxa_allocate_exception(0x30);
      local_38 = local_28;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"invalid buffer slot","");
      *puVar1 = &PTR__rtcore_error_02184a18;
      *(undefined4 *)(puVar1 + 1) = 2;
      puVar1[2] = puVar1 + 4;
      std::__cxx11::string::_M_construct<char*>((string *)(puVar1 + 2),local_38,local_38 + local_30)
      ;
      __cxa_throw(puVar1,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
    }
    ppcVar2 = (char **)((this->vertices).items + slot);
    if (pointerType == HOST) goto LAB_009ed637;
    if (pointerType != DEVICE) {
      puVar1 = (undefined8 *)__cxa_allocate_exception(0x30);
      local_38 = local_28;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_38,"invalid buffer data pointer type specified","");
      *puVar1 = &PTR__rtcore_error_02184a18;
      *(undefined4 *)(puVar1 + 1) = 2;
      puVar1[2] = puVar1 + 4;
      std::__cxx11::string::_M_construct<char*>((string *)(puVar1 + 2),local_38,local_38 + local_30)
      ;
      __cxa_throw(puVar1,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
    }
  }
  ppcVar2 = ppcVar2 + 1;
LAB_009ed637:
  return *ppcVar2;
}

Assistant:

void* Points::getBufferData(RTCBufferType type, unsigned int slot, BufferDataPointerType pointerType)
  {
    if (type == RTC_BUFFER_TYPE_VERTEX) {
      if (slot >= vertices.size())
        throw_RTCError(RTC_ERROR_INVALID_ARGUMENT, "invalid buffer slot");
      return vertices[slot].getPtr(pointerType);
    } else if (type == RTC_BUFFER_TYPE_NORMAL) {
      if (slot >= normals.size())
        throw_RTCError(RTC_ERROR_INVALID_ARGUMENT, "invalid buffer slot");
      return normals[slot].getPtr(pointerType);
    } else if (type == RTC_BUFFER_TYPE_VERTEX_ATTRIBUTE) {
      if (slot >= vertexAttribs.size())
        throw_RTCError(RTC_ERROR_INVALID_ARGUMENT, "invalid buffer slot");
      return vertexAttribs[slot].getPtr(pointerType);
    } else {
      throw_RTCError(RTC_ERROR_INVALID_ARGUMENT, "unknown buffer type");
      return nullptr;
    }
  }